

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

char * ngx_conf_set_access_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  ngx_array_t *pnVar2;
  void *pvVar3;
  char *__s1;
  long lVar4;
  int iVar5;
  long lVar6;
  sbyte sVar7;
  long lVar8;
  char *confp;
  ulong uVar9;
  ulong uVar10;
  ulong local_38;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) != -1) {
    return "is duplicate";
  }
  pnVar2 = cf->args;
  pvVar3 = pnVar2->elts;
  *(undefined8 *)((long)conf + nVar1) = 0;
  local_38 = 0x180;
  uVar10 = 1;
  uVar9 = 0;
  lVar4 = 6;
  do {
    if (pnVar2->nelts <= uVar10) {
      *(ulong *)((long)conf + nVar1) = uVar9 | local_38;
      return (char *)0x0;
    }
    __s1 = *(char **)((long)pvVar3 + 0x18);
    iVar5 = strncmp(__s1,"user:",5);
    if (iVar5 == 0) {
      local_38 = 0;
      lVar6 = 5;
      lVar8 = lVar4;
LAB_0011a1d8:
      sVar7 = (sbyte)lVar8;
    }
    else {
      iVar5 = strncmp(__s1,"group:",6);
      if (iVar5 == 0) {
        lVar6 = lVar4;
        lVar8 = 3;
        goto LAB_0011a1d8;
      }
      iVar5 = strncmp(__s1,"all:",4);
      if (iVar5 != 0) goto LAB_0011a223;
      lVar6 = 4;
      sVar7 = 0;
    }
    if ((__s1[lVar6] != 'r') ||
       (((__s1[lVar6 + 1] != 'w' || (lVar8 = lVar4, __s1[lVar6 + 2] != '\0')) &&
        (lVar8 = 4, __s1[lVar6 + 1] != '\0')))) {
LAB_0011a223:
      ngx_conf_log_error(1,cf,0,"invalid value \"%V\"");
      return (char *)0xffffffffffffffff;
    }
    uVar9 = uVar9 | lVar8 << sVar7;
    *(ulong *)((long)conf + nVar1) = uVar9;
    uVar10 = uVar10 + 1;
    pvVar3 = (void *)((long)pvVar3 + 0x10);
  } while( true );
}

Assistant:

char *
ngx_conf_set_access_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *confp = conf;

    u_char      *p;
    ngx_str_t   *value;
    ngx_uint_t   i, right, shift, *access, user;

    access = (ngx_uint_t *) (confp + cmd->offset);

    if (*access != NGX_CONF_UNSET_UINT) {
        return "is duplicate";
    }

    value = cf->args->elts;

    *access = 0;
    user = 0600;

    for (i = 1; i < cf->args->nelts; i++) {

        p = value[i].data;

        if (ngx_strncmp(p, "user:", sizeof("user:") - 1) == 0) {
            shift = 6;
            p += sizeof("user:") - 1;
            user = 0;

        } else if (ngx_strncmp(p, "group:", sizeof("group:") - 1) == 0) {
            shift = 3;
            p += sizeof("group:") - 1;

        } else if (ngx_strncmp(p, "all:", sizeof("all:") - 1) == 0) {
            shift = 0;
            p += sizeof("all:") - 1;

        } else {
            goto invalid;
        }

        if (ngx_strcmp(p, "rw") == 0) {
            right = 6;

        } else if (ngx_strcmp(p, "r") == 0) {
            right = 4;

        } else {
            goto invalid;
        }

        *access |= right << shift;
    }

    *access |= user;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid value \"%V\"", &value[i]);

    return NGX_CONF_ERROR;
}